

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O3

Vec_Int_t *
Gia_ManFxTopoOrder(Vec_Wec_t *vCubes,int nInputs,int nStart,Vec_Int_t **pvFirst,Vec_Int_t **pvCount)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  Vec_Int_t *vFirst;
  int *piVar3;
  int *__s;
  int **ppiVar4;
  Vec_Int_t *vOrder;
  Vec_Int_t *vVisit;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Vec_Int_t *local_68;
  
  iVar2 = vCubes->nSize;
  uVar11 = (ulong)iVar2;
  if ((long)uVar11 < 1) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = 0xffffffff;
    lVar10 = 0;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar10) < 1) goto LAB_00747ca0;
      uVar1 = **(uint **)((long)&vCubes->pArray->pArray + lVar10);
      if ((int)uVar9 <= (int)uVar1) {
        uVar9 = uVar1;
      }
      lVar10 = lVar10 + 0x10;
    } while (uVar11 << 4 != lVar10);
  }
  uVar1 = uVar9 + 1;
  uVar5 = (ulong)uVar1;
  if (uVar1 == nStart) {
    return (Vec_Int_t *)0x0;
  }
  vFirst = (Vec_Int_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar9) {
    uVar7 = uVar1;
  }
  vFirst->nCap = uVar7;
  if (uVar7 == 0) {
    piVar3 = (int *)0x0;
    vFirst->pArray = (int *)0x0;
    vFirst->nSize = uVar1;
    local_68 = (Vec_Int_t *)malloc(0x10);
    local_68->nCap = 0;
    local_68->pArray = (int *)0x0;
    local_68->nSize = uVar1;
    __s = (int *)0x0;
  }
  else {
    __size = (ulong)uVar7 * 4;
    piVar3 = (int *)malloc(__size);
    vFirst->pArray = piVar3;
    vFirst->nSize = uVar1;
    if (piVar3 != (int *)0x0) {
      memset(piVar3,0,uVar5 * 4);
    }
    local_68 = (Vec_Int_t *)malloc(0x10);
    local_68->nCap = uVar7;
    __s = (int *)malloc(__size);
    local_68->pArray = __s;
    local_68->nSize = uVar1;
    if (__s == (int *)0x0) {
      __s = (int *)0x0;
    }
    else {
      memset(__s,0,uVar5 * 4);
    }
  }
  if (0 < iVar2) {
    ppiVar4 = &vCubes->pArray->pArray;
    uVar6 = 0;
    do {
      if (*(int *)((long)ppiVar4 + -4) < 1) goto LAB_00747ca0;
      uVar8 = **ppiVar4;
      if ((int)uVar8 < nInputs) {
        __assert_fail("iFanin >= nInputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                      ,0x126,
                      "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                     );
      }
      if (((int)uVar8 < 0) || ((int)uVar9 < (int)uVar8)) goto LAB_00747ca0;
      if (__s[uVar8] == 0) {
        piVar3[uVar8] = (int)uVar6;
      }
      __s[uVar8] = __s[uVar8] + 1;
      uVar6 = uVar6 + 1;
      ppiVar4 = ppiVar4 + 2;
    } while (uVar6 < uVar11);
  }
  vOrder = (Vec_Int_t *)malloc(0x10);
  uVar8 = nInputs - 1;
  iVar2 = 0x10;
  if (0xe < uVar8) {
    iVar2 = nInputs;
  }
  vOrder->nCap = iVar2;
  if (iVar2 == 0) {
    vOrder->pArray = (int *)0x0;
    vOrder->nSize = nInputs;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
    vOrder->pArray = piVar3;
    vOrder->nSize = nInputs;
    if (piVar3 != (int *)0x0) {
      memset(piVar3,0,(long)nInputs << 2);
    }
  }
  vVisit = (Vec_Int_t *)malloc(0x10);
  vVisit->nCap = uVar7;
  if (uVar7 == 0) {
    vVisit->pArray = (int *)0x0;
    vVisit->nSize = uVar1;
  }
  else {
    piVar3 = (int *)malloc((ulong)uVar7 << 2);
    vVisit->pArray = piVar3;
    vVisit->nSize = uVar1;
    if (piVar3 != (int *)0x0) {
      memset(piVar3,0,uVar5 << 2);
      goto LAB_00747bd0;
    }
  }
  piVar3 = (int *)0x0;
LAB_00747bd0:
  uVar11 = (ulong)(uint)nInputs;
  if (0 < nInputs) {
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    do {
      if (uVar6 == uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar3[uVar5] = 1;
      uVar5 = uVar5 + 1;
    } while (uVar11 != uVar5);
  }
  if (nInputs <= (int)uVar9) {
    do {
      if ((nInputs < 0) || ((int)uVar9 < (int)uVar11)) {
LAB_00747ca0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (piVar3[uVar11] == 0) {
        Gia_ManFxTopoOrder_rec(vCubes,vFirst,local_68,vVisit,vOrder,(int)uVar11);
      }
      uVar11 = uVar11 + 1;
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (int)uVar9);
    nInputs = vOrder->nSize;
  }
  if (nInputs == uVar1) {
    if (piVar3 != (int *)0x0) {
      free(piVar3);
    }
    free(vVisit);
    *pvFirst = vFirst;
    *pvCount = local_68;
    return vOrder;
  }
  __assert_fail("Vec_IntSize(vOrder) == nNodeMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                ,0x133,
                "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)");
}

Assistant:

Vec_Int_t * Gia_ManFxTopoOrder( Vec_Wec_t * vCubes, int nInputs, int nStart, Vec_Int_t ** pvFirst, Vec_Int_t ** pvCount )
{
    Vec_Int_t * vOrder, * vFirst, * vCount, * vVisit, * vCube;
    int i, iFanin, nNodeMax = -1;
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        nNodeMax = Abc_MaxInt( nNodeMax, Vec_IntEntry(vCube, 0) );
    nNodeMax++;
    // quit if there is no new nodes
    if ( nNodeMax == nStart )
    {
        //printf( "The network is unchanged by fast extract.\n" );
        return NULL;
    }
    // find first cube and how many cubes
    vFirst = Vec_IntStart( nNodeMax );
    vCount = Vec_IntStart( nNodeMax );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        assert( iFanin >= nInputs );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // put all of them in a topo order
    vOrder = Vec_IntStart( nInputs );
    vVisit = Vec_IntStart( nNodeMax );
    for ( i = 0; i < nInputs; i++ )
        Vec_IntWriteEntry( vVisit, i, 1 );
    for ( i = nInputs; i < nNodeMax; i++ )
        if ( !Vec_IntEntry( vVisit, i ) )
            Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, i );
    assert( Vec_IntSize(vOrder) == nNodeMax );
    Vec_IntFree( vVisit );
    // return topological order of new nodes
    *pvFirst = vFirst;
    *pvCount = vCount;
    return vOrder;
}